

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O0

void __thiscall
kj::MainBuilder::MainImpl::usageError(MainImpl *this,StringPtr programName,StringPtr message)

{
  size_t *this_00;
  ProcessContext *pPVar1;
  int iVar2;
  Impl *pIVar3;
  char (*in_stack_ffffffffffffff80) [31];
  String local_58;
  StringPtr local_40;
  MainImpl *local_30;
  MainImpl *this_local;
  StringPtr message_local;
  StringPtr programName_local;
  
  message_local.content.ptr = (char *)message.content.size_;
  this_local = (MainImpl *)message.content.ptr;
  message_local.content.size_ = (size_t)programName.content.ptr;
  local_30 = this;
  pIVar3 = Own<kj::MainBuilder::Impl,_std::nullptr_t>::operator->(&this->impl);
  pPVar1 = pIVar3->context;
  this_00 = &message_local.content.size_;
  str<kj::StringPtr&,char_const(&)[3],kj::StringPtr&,char_const(&)[7],kj::StringPtr&,char_const(&)[31]>
            (&local_58,(kj *)this_00,(StringPtr *)0x383a1f,(char (*) [3])&this_local,
             (StringPtr *)"\nTry \'",(char (*) [7])this_00,
             (StringPtr *)" --help\' for more information.",in_stack_ffffffffffffff80);
  StringPtr::StringPtr(&local_40,&local_58);
  iVar2 = (*pPVar1->_vptr_ProcessContext[4])(pPVar1,local_40.content.ptr,local_40.content.size_);
  String::~String(&local_58);
  _Unwind_Resume(iVar2);
}

Assistant:

void MainBuilder::MainImpl::usageError(StringPtr programName, StringPtr message) {
  impl->context.exitError(kj::str(
      programName, ": ", message,
      "\nTry '", programName, " --help' for more information."));
  KJ_CLANG_KNOWS_THIS_IS_UNREACHABLE_BUT_GCC_DOESNT
}